

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_util.hpp
# Opt level: O3

size_t ans_serialize_interp
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *vec,size_t frame_size,
                 uint8_t **out_u8)

{
  uint8_t *puVar1;
  uint32_t *puVar2;
  pointer puVar3;
  int iVar4;
  uint32_t uVar5;
  size_t sVar6;
  uint uVar7;
  ulong uVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 in_ZMM0 [64];
  vector<unsigned_int,_std::allocator<unsigned_int>_> increasing_freqs;
  bit_stream local_98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  auVar10 = in_ZMM0._0_16_;
  iVar4 = (int)((ulong)((long)(vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Vector_impl_data._M_start) >> 2);
  vbyte_encode_u32(out_u8,iVar4 - 1);
  auVar10 = vcvtusi2sd_avx512f(auVar10,frame_size);
  dVar9 = log2(auVar10._0_8_);
  puVar1 = *out_u8;
  *out_u8 = puVar1 + 1;
  *puVar1 = (uint8_t)(int)dVar9;
  puVar2 = (uint32_t *)*out_u8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_48,
             (long)(vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2,(allocator_type *)&local_98);
  puVar3 = (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = iVar4 - 1;
  *local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = *puVar3;
  if (uVar7 != 0) {
    uVar5 = *local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = 0;
    do {
      uVar5 = uVar5 + 1 + puVar3[uVar8 + 1];
      local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar8 + 1] = uVar5;
      uVar8 = uVar8 + 1;
    } while (uVar7 != uVar8);
  }
  local_98.first_ptr = local_98.buf;
  sVar6 = (long)(vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar3 >> 2;
  local_98.write_mode = true;
  local_98.last_ptr = local_98.buf + 1;
  local_98.in_word_offset = '\0';
  local_98.bytes_written = 0;
  local_98.bytes_consumed = 0;
  local_98.of = puVar2;
  local_98.cur_ptr = local_98.first_ptr;
  interpolative_internal::encode_interpolative
            (&local_98,
             local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,sVar6,1,frame_size + 2 + sVar6);
  sVar6 = local_98.bytes_written;
  if ((local_98.write_mode == true) && (local_98.in_word_offset != '\0')) {
    *local_98.of = *local_98.first_ptr;
    sVar6 = local_98.bytes_written + 4;
  }
  *out_u8 = *out_u8 + sVar6;
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint32_t *)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return sVar6;
}

Assistant:

size_t ans_serialize_interp(
    std::vector<uint32_t>& vec, size_t frame_size, uint8_t*& out_u8)
{
    uint32_t max_sym = vec.size() - 1;
    vbyte_encode_u32(out_u8, max_sym);
    *out_u8++ = log2(frame_size); // must be power of 2
    auto out_ptr_u32 = reinterpret_cast<uint32_t*>(out_u8);
    std::vector<uint32_t> increasing_freqs(vec.size());
    increasing_freqs[0] = vec[0];
    for (size_t sym = 1; sym <= max_sym; sym++) {
        increasing_freqs[sym] = increasing_freqs[sym - 1] + vec[sym] + 1;
    }
    auto in_buf = increasing_freqs.data();
    auto bytes_written = interpolative_internal::encode(
        out_ptr_u32, in_buf, vec.size(), frame_size + vec.size() + 1);
    out_u8 += bytes_written;
    return bytes_written;
}